

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server_test.c
# Opt level: O1

void test_server_uri_too_long(void)

{
  nng_err nVar1;
  int iVar2;
  nng_http_status nVar3;
  size_t size;
  char *pcVar4;
  char local_8858 [8];
  char buf [32768];
  undefined1 local_850 [8];
  server_test st;
  nng_http_handler *h;
  
  pcVar4 = doc1;
  size = strlen(doc1);
  nVar1 = nng_http_handler_alloc_static
                    ((nng_http_handler **)(st.urlstr + 0x7f8),"/home.html",pcVar4,size,"text/html");
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,499,"%s: expected success, got %s (%d)",
                         "nng_http_handler_alloc_static( &h, \"/home.html\", doc1, strlen(doc1), \"text/html\")"
                         ,pcVar4,nVar1);
  if (iVar2 != 0) {
    server_setup((server_test *)local_850,(nng_http_handler *)st.urlstr._2040_8_);
    memset(local_8858,0x61,0x7fff);
    local_8858[0] = '/';
    buf[0x7ff7] = '\0';
    nVar1 = nng_http_set_uri((nng_http *)st.cli,local_8858,(char *)0x0);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                           ,0x1fb,"%s: expected success, got %s (%d)",
                           "nng_http_set_uri(st.conn, buf, NULL)",pcVar4,nVar1);
    if (iVar2 != 0) {
      nng_http_write_request((nng_http *)st.cli,(nng_aio *)st.url);
      nng_aio_wait((nng_aio *)st.url);
      nVar1 = nng_aio_result((nng_aio *)st.url);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                             ,0x1ff,"%s: expected success, got %s (%d)","nng_aio_result(st.aio)",
                             pcVar4,nVar1);
      if (iVar2 != 0) {
        nng_http_read_response((nng_http *)st.cli,(nng_aio *)st.url);
        nng_aio_wait((nng_aio *)st.url);
        nVar1 = nng_aio_result((nng_aio *)st.url);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                               ,0x203,"%s: expected success, got %s (%d)","nng_aio_result(st.aio)",
                               pcVar4,nVar1);
        if (iVar2 != 0) {
          nVar3 = nng_http_get_status((nng_http *)st.cli);
          acutest_check_((uint)(nVar3 == NNG_HTTP_STATUS_URI_TOO_LONG),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,0x205,"%s",
                         "nng_http_get_status(st.conn) == (NNG_HTTP_STATUS_URI_TOO_LONG)");
          nVar3 = nng_http_get_status((nng_http *)st.cli);
          pcVar4 = nng_http_get_reason((nng_http *)st.cli);
          acutest_message_("HTTP status: expected %d (%s) got %d (%s)",0x19e,
                           "NNG_HTTP_STATUS_URI_TOO_LONG",(ulong)nVar3,pcVar4);
          server_free((server_test *)local_850);
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_server_uri_too_long(void)
{
	struct server_test st;
	nng_http_handler  *h;
	char               buf[32768];

	NUTS_PASS(nng_http_handler_alloc_static(
	    &h, "/home.html", doc1, strlen(doc1), "text/html"));

	server_setup(&st, h);

	memset(buf, 'a', sizeof(buf) - 1);
	buf[0]               = '/';
	buf[sizeof(buf) - 1] = 0;

	NUTS_PASS(nng_http_set_uri(st.conn, buf, NULL));
	nng_http_write_request(st.conn, st.aio);

	nng_aio_wait(st.aio);
	NUTS_PASS(nng_aio_result(st.aio));

	nng_http_read_response(st.conn, st.aio);
	nng_aio_wait(st.aio);
	NUTS_PASS(nng_aio_result(st.aio));

	NUTS_HTTP_STATUS(st.conn, NNG_HTTP_STATUS_URI_TOO_LONG);

	server_free(&st);
}